

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::erase
          (Data<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *this,
          Bucket bucket)

{
  byte bVar1;
  Span *pSVar2;
  ulong uVar3;
  size_t seed;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  Span *pSVar7;
  Span *pSVar8;
  Span *fromSpan;
  size_t fromIndex;
  size_t to;
  Span<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_> *this_00;
  QByteArrayView key;
  
  Span<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::erase
            (bucket.span,bucket.index);
  this->size = this->size - 1;
  to = bucket.index;
  this_00 = bucket.span;
LAB_0029d713:
  pSVar2 = this->spans;
  uVar3 = this->numBuckets;
  seed = this->seed;
  uVar4 = uVar3 >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar4 == 0) {
          fromSpan = pSVar2;
        }
        fromIndex = 0;
      }
      bVar1 = fromSpan->offsets[fromIndex];
      if (bVar1 == 0xff) {
        return;
      }
      key.m_data = *(storage_type **)(fromSpan->entries[bVar1].storage.data + 8);
      key.m_size = *(qsizetype *)(fromSpan->entries[bVar1].storage.data + 0x10);
      sVar5 = ::qHash(key,seed);
      uVar6 = sVar5 & uVar3 - 1;
      pSVar7 = pSVar2 + (uVar6 >> 7);
      uVar6 = (ulong)((uint)uVar6 & 0x7f);
    } while (uVar6 == fromIndex && pSVar7 == fromSpan);
    do {
      if ((pSVar7 == this_00) && (uVar6 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QHashPrivate::Node<QByteArray,_const_QtPrivate::QMetaTypeInterface_*>_>::moveFromSpan
                    (this_00,fromSpan,fromIndex,to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_0029d713;
      }
      uVar6 = uVar6 + 1;
      if (uVar6 == 0x80) {
        pSVar8 = pSVar7 + 1;
        pSVar7 = pSVar2;
        if (((long)pSVar8 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar4 != 0) {
          pSVar7 = pSVar8;
        }
        uVar6 = 0;
      }
    } while ((pSVar7 != fromSpan) || (uVar6 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }